

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

int cookie_sort(void *p1,void *p2)

{
  long lVar1;
  long lVar2;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  size_t l2;
  size_t l1;
  Cookie *c2;
  Cookie *c1;
  void *p2_local;
  void *p1_local;
  
  lVar1 = *p1;
  lVar2 = *p2;
  if (*(long *)(lVar1 + 0x50) == 0) {
    local_48 = 0;
  }
  else {
    local_48 = strlen(*(char **)(lVar1 + 0x50));
  }
  if (*(long *)(lVar2 + 0x50) == 0) {
    local_50 = 0;
  }
  else {
    local_50 = strlen(*(char **)(lVar2 + 0x50));
  }
  if (local_48 == local_50) {
    if (*(long *)(lVar1 + 0x60) == 0) {
      local_58 = 0;
    }
    else {
      local_58 = strlen(*(char **)(lVar1 + 0x60));
    }
    if (*(long *)(lVar2 + 0x60) == 0) {
      local_60 = 0;
    }
    else {
      local_60 = strlen(*(char **)(lVar2 + 0x60));
    }
    if (local_58 == local_60) {
      if (*(long *)(lVar1 + 0x40) == 0) {
        local_68 = 0;
      }
      else {
        local_68 = strlen(*(char **)(lVar1 + 0x40));
      }
      if (*(long *)(lVar2 + 0x40) == 0) {
        local_70 = 0;
      }
      else {
        local_70 = strlen(*(char **)(lVar2 + 0x40));
      }
      if (local_68 == local_70) {
        p1_local._4_4_ = -1;
        if (*(uint *)(lVar1 + 0x70) < *(uint *)(lVar2 + 0x70)) {
          p1_local._4_4_ = 1;
        }
      }
      else {
        p1_local._4_4_ = -1;
        if (local_68 < local_70) {
          p1_local._4_4_ = 1;
        }
      }
    }
    else {
      p1_local._4_4_ = -1;
      if (local_58 < local_60) {
        p1_local._4_4_ = 1;
      }
    }
  }
  else {
    p1_local._4_4_ = -1;
    if (local_48 < local_50) {
      p1_local._4_4_ = 1;
    }
  }
  return p1_local._4_4_;
}

Assistant:

static int cookie_sort(const void *p1, const void *p2)
{
  const struct Cookie *c1 = *(const struct Cookie * const *)p1;
  const struct Cookie *c2 = *(const struct Cookie * const *)p2;
  size_t l1, l2;

  /* 1 - compare cookie path lengths */
  l1 = c1->path ? strlen(c1->path) : 0;
  l2 = c2->path ? strlen(c2->path) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1; /* avoid size_t <=> int conversions */

  /* 2 - compare cookie domain lengths */
  l1 = c1->domain ? strlen(c1->domain) : 0;
  l2 = c2->domain ? strlen(c2->domain) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1; /* avoid size_t <=> int conversions */

  /* 3 - compare cookie name lengths */
  l1 = c1->name ? strlen(c1->name) : 0;
  l2 = c2->name ? strlen(c2->name) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1;

  /* 4 - compare cookie creation time */
  return (c2->creationtime > c1->creationtime) ? 1 : -1;
}